

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O0

void __thiscall
cnn::GRUBuilder::GRUBuilder
          (GRUBuilder *this,uint layers,uint input_dim,uint hidden_dim,Model *model)

{
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<cnn::Parameters_*> __l;
  Parameters *pPVar1;
  Parameters *this_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  Dim *in_R8;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> ps;
  Parameters *p_bh;
  Parameters *p_h2h;
  Parameters *p_x2h;
  Parameters *p_br;
  Parameters *p_h2r;
  Parameters *p_x2r;
  Parameters *p_bz;
  Parameters *p_h2z;
  Parameters *p_x2z;
  uint i;
  uint layer_input_dim;
  RNNBuilder *in_stack_fffffffffffffc10;
  Dim *__x;
  Parameters *in_stack_fffffffffffffc30;
  Dim *in_stack_fffffffffffffc38;
  Parameters *in_stack_fffffffffffffc40;
  Dim *pDVar2;
  Parameters *local_330;
  Parameters *local_328;
  Parameters *local_320;
  Parameters *local_318;
  Parameters *local_310;
  Parameters *local_308;
  Parameters *local_300;
  Parameters *local_2f8;
  Parameters *local_2f0;
  Parameters **local_2e8;
  undefined8 local_2e0;
  undefined4 local_2bc;
  undefined4 *local_2b8;
  undefined8 local_2b0;
  Parameters *local_280;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 *local_270;
  undefined8 local_268;
  Parameters *local_238;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 *local_228;
  undefined8 local_220;
  Parameters *local_1f0;
  undefined4 local_1e4;
  undefined4 *local_1e0;
  undefined8 local_1d8;
  Parameters *local_1a8;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 *local_198;
  undefined8 local_190;
  Parameters *local_160;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 *local_150;
  undefined8 local_148;
  Parameters *local_118;
  undefined4 local_10c;
  undefined4 *local_108;
  undefined8 local_100;
  Parameters *local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 *local_c0;
  undefined8 local_b8;
  Parameters *local_88;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 *local_68;
  undefined8 local_60;
  Parameters *local_30;
  uint local_28;
  undefined4 local_24;
  Dim *local_20;
  undefined4 local_14;
  undefined4 local_10;
  uint local_c;
  
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  RNNBuilder::RNNBuilder(in_stack_fffffffffffffc10);
  *in_RDI = &PTR__GRUBuilder_008fbf90;
  std::
  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ::vector((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
            *)0x5e7148);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)0x5e7161);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
            *)0x5e717a);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)0x5e7193);
  *(undefined4 *)(in_RDI + 0x11) = local_14;
  *(uint *)((long)in_RDI + 0x8c) = local_c;
  local_24 = local_10;
  for (local_28 = 0; local_28 < local_c; local_28 = local_28 + 1) {
    local_70 = local_14;
    local_6c = local_24;
    local_68 = &local_70;
    local_60 = 2;
    x._M_len = (size_type)in_stack_fffffffffffffc40;
    x._M_array = in_stack_fffffffffffffc38->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffc30,x);
    local_30 = Model::add_parameters
                         ((Model *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                          (float)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    local_c8 = local_14;
    local_c4 = local_14;
    local_c0 = &local_c8;
    local_b8 = 2;
    x_00._M_len = (size_type)in_stack_fffffffffffffc40;
    x_00._M_array = in_stack_fffffffffffffc38->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffc30,x_00);
    local_88 = Model::add_parameters
                         ((Model *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                          (float)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    local_10c = local_14;
    local_108 = &local_10c;
    local_100 = 1;
    x_01._M_len = (size_type)in_stack_fffffffffffffc40;
    x_01._M_array = in_stack_fffffffffffffc38->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffc30,x_01);
    local_d0 = Model::add_parameters
                         ((Model *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                          (float)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    local_158 = local_14;
    local_154 = local_24;
    local_150 = &local_158;
    local_148 = 2;
    x_02._M_len = (size_type)in_stack_fffffffffffffc40;
    x_02._M_array = in_stack_fffffffffffffc38->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffc30,x_02);
    local_118 = Model::add_parameters
                          ((Model *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                           (float)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    local_1a0 = local_14;
    local_19c = local_14;
    local_198 = &local_1a0;
    local_190 = 2;
    x_03._M_len = (size_type)in_stack_fffffffffffffc40;
    x_03._M_array = in_stack_fffffffffffffc38->d;
    Dim::Dim((Dim *)in_stack_fffffffffffffc30,x_03);
    pPVar1 = Model::add_parameters
                       ((Model *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                        (float)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    local_1e4 = local_14;
    local_1e0 = &local_1e4;
    local_1d8 = 1;
    x_04._M_len = (size_type)in_stack_fffffffffffffc40;
    x_04._M_array = in_stack_fffffffffffffc38->d;
    pDVar2 = local_20;
    local_160 = pPVar1;
    Dim::Dim((Dim *)in_stack_fffffffffffffc30,x_04);
    in_stack_fffffffffffffc40 =
         Model::add_parameters
                   ((Model *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                    (float)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    local_230 = local_14;
    local_22c = local_24;
    local_228 = &local_230;
    local_220 = 2;
    x_05._M_len = (size_type)in_stack_fffffffffffffc40;
    x_05._M_array = local_20->d;
    in_stack_fffffffffffffc38 = local_20;
    local_1a8 = in_stack_fffffffffffffc40;
    Dim::Dim((Dim *)in_stack_fffffffffffffc30,x_05);
    in_stack_fffffffffffffc30 =
         Model::add_parameters
                   ((Model *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                    (float)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    local_278 = local_14;
    local_274 = local_14;
    local_270 = &local_278;
    local_268 = 2;
    x_06._M_len = (size_type)in_stack_fffffffffffffc40;
    x_06._M_array = in_stack_fffffffffffffc38->d;
    local_1f0 = in_stack_fffffffffffffc30;
    Dim::Dim((Dim *)in_stack_fffffffffffffc30,x_06);
    this_00 = Model::add_parameters
                        ((Model *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                         (float)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    local_2bc = local_14;
    local_2b8 = &local_2bc;
    local_2b0 = 1;
    x_07._M_len = (size_type)in_stack_fffffffffffffc40;
    x_07._M_array = in_stack_fffffffffffffc38->d;
    __x = local_20;
    local_238 = this_00;
    Dim::Dim((Dim *)in_stack_fffffffffffffc30,x_07);
    local_2f0 = Model::add_parameters
                          ((Model *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                           (float)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    local_24 = local_14;
    local_330 = local_30;
    local_328 = local_88;
    local_320 = local_d0;
    local_318 = local_118;
    local_310 = local_160;
    local_308 = local_1a8;
    local_300 = local_1f0;
    local_2f8 = local_238;
    local_2e8 = &local_330;
    local_2e0 = 9;
    local_280 = local_2f0;
    std::allocator<cnn::Parameters_*>::allocator((allocator<cnn::Parameters_*> *)0x5e778a);
    __l._M_len = (size_type)pPVar1;
    __l._M_array = (iterator)pDVar2;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::vector
              ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
               in_stack_fffffffffffffc40,__l,(allocator_type *)in_stack_fffffffffffffc38);
    std::allocator<cnn::Parameters_*>::~allocator((allocator<cnn::Parameters_*> *)0x5e77ba);
    std::
    vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
    ::push_back((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                 *)this_00,(value_type *)__x);
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::~vector
              ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)this_00);
  }
  return;
}

Assistant:

GRUBuilder::GRUBuilder(unsigned layers,
                       unsigned input_dim,
                       unsigned hidden_dim,
                       Model* model) : hidden_dim(hidden_dim), layers(layers) {
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    // z
    Parameters* p_x2z = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2z = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bz = model->add_parameters({hidden_dim});

    // r
    Parameters* p_x2r = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2r = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_br = model->add_parameters({hidden_dim});

    // h
    Parameters* p_x2h = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2h = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bh = model->add_parameters({hidden_dim});
    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameters*> ps = {p_x2z, p_h2z, p_bz, p_x2r, p_h2r, p_br, p_x2h, p_h2h, p_bh};
    params.push_back(ps);
  }  // layers
}